

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::add_to_each<int>(Omega_h *this,Read<int> *a,int b)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_d8;
  undefined1 local_c8 [8];
  type_conflict f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<int> c;
  int b_local;
  Read<int> *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr._4_4_ = b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<int>::Write((Write<int> *)local_68,(LO)(local_10 >> 2),(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<int>::Write((Write<int> *)local_c8,(Write<int> *)local_68);
  Read<int>::Read((Read<int> *)&f.c.shared_alloc_.direct_ptr,a);
  f.a.write_.shared_alloc_.direct_ptr._0_4_ = c.shared_alloc_.direct_ptr._4_4_;
  if (((ulong)local_68 & 1) == 0) {
    local_20 = *(size_t *)local_68;
  }
  else {
    local_20 = (ulong)local_68 >> 3;
  }
  parallel_for<Omega_h::add_to_each<int>(Omega_h::Read<int>,int)::_lambda(int)_1_>
            ((LO)(local_20 >> 2),(type_conflict *)local_c8,"add_to_each");
  Write<int>::Write(&local_d8,(Write<int> *)local_68);
  Read<int>::Read((Read<int> *)this,&local_d8);
  Write<int>::~Write(&local_d8);
  add_to_each<int>(Omega_h::Read<int>,int)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_c8);
  Write<int>::~Write((Write<int> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> add_to_each(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] + b; };
  parallel_for(c.size(), f, "add_to_each");
  return c;
}